

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *target,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  bool globalAutoRccTarget_local;
  bool globalAutogenTarget_local;
  bool rccEnabled_local;
  bool uicEnabled_local;
  bool mocEnabled_local;
  IntegerVersion *qtVersion_local;
  cmGeneratorTarget *target_local;
  cmQtAutoGenGlobalInitializer *globalInitializer_local;
  cmQtAutoGenInitializer *this_local;
  
  this->GlobalInitializer = globalInitializer;
  this->Target = target;
  this->QtVersion = *qtVersion;
  this->MultiConfig = false;
  std::__cxx11::string::string((string *)&this->ConfigDefault);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ConfigsList);
  std::__cxx11::string::string((string *)&this->Verbosity);
  std::__cxx11::string::string((string *)&this->TargetsFolder);
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  {unnamed_type#1}::cmQtAutoGenInitializer((_unnamed_type_1_ *)&this->Dir);
  {unnamed_type#2}::cmQtAutoGenInitializer((_unnamed_type_2_ *)&this->AutogenTarget);
  MocT::MocT(&this->Moc);
  UicT::UicT(&this->Uic);
  RccT::RccT(&this->Rcc);
  (this->AutogenTarget).GlobalTarget = globalAutogenTarget;
  (this->Moc).super_GenVarsT.Enabled = mocEnabled;
  (this->Uic).super_GenVarsT.Enabled = uicEnabled;
  (this->Rcc).super_GenVarsT.Enabled = rccEnabled;
  (this->Rcc).GlobalTarget = globalAutoRccTarget;
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer, cmGeneratorTarget* target,
  IntegerVersion const& qtVersion, bool mocEnabled, bool uicEnabled,
  bool rccEnabled, bool globalAutogenTarget, bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , Target(target)
  , QtVersion(qtVersion)
{
  AutogenTarget.GlobalTarget = globalAutogenTarget;
  Moc.Enabled = mocEnabled;
  Uic.Enabled = uicEnabled;
  Rcc.Enabled = rccEnabled;
  Rcc.GlobalTarget = globalAutoRccTarget;
}